

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  operator<<(poVar1,(Version *)libraryVersion);
  std::operator<<(poVar1,"\n");
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "For more detail usage please see the project docs\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            Catch::cout() << "\nCatch v" << libraryVersion << "\n";

            m_cli.usage( Catch::cout(), processName );
            Catch::cout() << "For more detail usage please see the project docs\n" << std::endl;
        }